

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoapySDRProbe.cpp
# Opt level: O2

string * SoapySDRDeviceProbe_abi_cxx11_(string *__return_storage_ptr__,Device *device)

{
  char cVar1;
  ostream *poVar2;
  undefined8 uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t chan;
  size_t chan_00;
  char *pcVar6;
  size_t chan_1;
  string clockSources;
  string registers;
  string timeSources;
  string uarts;
  string gpios;
  string settings;
  string sensors;
  string local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::endl<char,std::char_traits<char>>(local_1a8);
  poVar2 = std::operator<<(local_1a8,"----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_1a8,"-- Device identification");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_1a8,"----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_1a8,"  driver=");
  (**(code **)(*(long *)device + 0x10))(&clockSources,device);
  poVar2 = std::operator<<(poVar2,(string *)&clockSources);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&clockSources);
  poVar2 = std::operator<<(local_1a8,"  hardware=");
  (**(code **)(*(long *)device + 0x18))(&clockSources,device);
  poVar2 = std::operator<<(poVar2,(string *)&clockSources);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&clockSources);
  (**(code **)(*(long *)device + 0x20))(&clockSources,device);
  for (uVar3 = clockSources.field_2._8_8_; (size_type *)uVar3 != &clockSources._M_string_length;
      uVar3 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar3)) {
    poVar2 = std::operator<<(local_1a8,"  ");
    poVar2 = std::operator<<(poVar2,(string *)(uVar3 + 0x20));
    poVar2 = std::operator<<(poVar2,"=");
    poVar2 = std::operator<<(poVar2,(string *)(uVar3 + 0x40));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&clockSources);
  std::endl<char,std::char_traits<char>>(local_1a8);
  poVar2 = std::operator<<(local_1a8,"----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_1a8,"-- Peripheral summary");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_1a8,"----------------------------------------------------");
  std::endl<char,std::char_traits<char>>(poVar2);
  sVar4 = (**(code **)(*(long *)device + 0x38))(device,1);
  sVar5 = (**(code **)(*(long *)device + 0x38))(device,0);
  poVar2 = std::operator<<(local_1a8,"  Channels: ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," Rx, ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," Tx");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(local_1a8,"  Timestamps: ");
  std::__cxx11::string::string((string *)&clockSources,"",(allocator *)&timeSources);
  cVar1 = (**(code **)(*(long *)device + 0x298))(device,&clockSources);
  pcVar6 = "NO";
  if (cVar1 != '\0') {
    pcVar6 = "YES";
  }
  poVar2 = std::operator<<(poVar2,pcVar6);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&clockSources);
  (**(code **)(*(long *)device + 0x268))(&timeSources,device);
  toString<std::__cxx11::string>
            (&clockSources,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&timeSources);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&timeSources);
  if (clockSources._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  Clock sources: ");
    poVar2 = std::operator<<(poVar2,(string *)&clockSources);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  (**(code **)(*(long *)device + 0x280))(&sensors,device);
  toString<std::__cxx11::string>
            (&timeSources,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&sensors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sensors);
  if (timeSources._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  Time sources: ");
    poVar2 = std::operator<<(poVar2,(string *)&timeSources);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  (**(code **)(*(long *)device + 0x2b8))(&registers,device);
  toString<std::__cxx11::string>
            (&sensors,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&registers);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&registers);
  if (sensors._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  Sensors: ");
    poVar2 = std::operator<<(poVar2,(string *)&sensors);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  sensorReadings_abi_cxx11_(&registers,device);
  std::operator<<(local_1a8,(string *)&registers);
  std::__cxx11::string::~string((string *)&registers);
  (**(code **)(*(long *)device + 0x2e8))(&settings,device);
  toString<std::__cxx11::string>
            (&registers,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&settings);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&settings);
  if (registers._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  Registers: ");
    poVar2 = std::operator<<(poVar2,(string *)&registers);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  (**(code **)(*(long *)device + 800))(&gpios,device);
  toString_abi_cxx11_(&settings,(ArgInfoList *)&gpios);
  std::vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_>::~vector
            ((vector<SoapySDR::ArgInfo,_std::allocator<SoapySDR::ArgInfo>_> *)&gpios);
  if (settings._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  Other Settings:");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<(poVar2,(string *)&settings);
  }
  (**(code **)(*(long *)device + 0x360))(&uarts,device);
  toString<std::__cxx11::string>
            (&gpios,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&uarts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&uarts);
  if (gpios._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  GPIOs: ");
    poVar2 = std::operator<<(poVar2,(string *)&gpios);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  (**(code **)(*(long *)device + 0x3b0))(&local_1d8,device);
  toString<std::__cxx11::string>
            (&uarts,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  if (uarts._M_string_length != 0) {
    poVar2 = std::operator<<(local_1a8,"  UARTs: ");
    poVar2 = std::operator<<(poVar2,(string *)&uarts);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  for (chan_00 = 0; sVar4 != chan_00; chan_00 = chan_00 + 1) {
    probeChannel_abi_cxx11_(&local_1d8,device,1,chan_00);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  for (sVar4 = 0; sVar5 != sVar4; sVar4 = sVar4 + 1) {
    probeChannel_abi_cxx11_(&local_1d8,device,0,sVar4);
    std::operator<<(local_1a8,(string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::~string((string *)&uarts);
  std::__cxx11::string::~string((string *)&gpios);
  std::__cxx11::string::~string((string *)&settings);
  std::__cxx11::string::~string((string *)&registers);
  std::__cxx11::string::~string((string *)&sensors);
  std::__cxx11::string::~string((string *)&timeSources);
  std::__cxx11::string::~string((string *)&clockSources);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string SoapySDRDeviceProbe(SoapySDR::Device *device)
{
    std::stringstream ss;

    /*******************************************************************
     * Identification info
     ******************************************************************/
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- Device identification" << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    ss << "  driver=" << device->getDriverKey() << std::endl;
    ss << "  hardware=" << device->getHardwareKey() << std::endl;
    for (const auto &it : device->getHardwareInfo())
    {
        ss << "  " << it.first << "=" << it.second << std::endl;
    }

    /*******************************************************************
     * Available peripherals
     ******************************************************************/
    ss << std::endl;
    ss << "----------------------------------------------------" << std::endl;
    ss << "-- Peripheral summary" << std::endl;
    ss << "----------------------------------------------------" << std::endl;

    size_t numRxChans = device->getNumChannels(SOAPY_SDR_RX);
    size_t numTxChans = device->getNumChannels(SOAPY_SDR_TX);
    ss << "  Channels: " << numRxChans << " Rx, " << numTxChans << " Tx" << std::endl;

    ss << "  Timestamps: " << (device->hasHardwareTime()?"YES":"NO") << std::endl;

    std::string clockSources = toString(device->listClockSources());
    if (not clockSources.empty()) ss << "  Clock sources: " << clockSources << std::endl;

    std::string timeSources = toString(device->listTimeSources());
    if (not timeSources.empty()) ss << "  Time sources: " << timeSources << std::endl;

    std::string sensors = toString(device->listSensors());
    if (not sensors.empty()) ss << "  Sensors: " << sensors << std::endl;
    ss << sensorReadings(device);

    std::string registers = toString(device->listRegisterInterfaces());
    if (not registers.empty()) ss << "  Registers: " << registers << std::endl;

    std::string settings = toString(device->getSettingInfo());
    if (not settings.empty()) ss << "  Other Settings:" << std::endl << settings;

    std::string gpios = toString(device->listGPIOBanks());
    if (not gpios.empty()) ss << "  GPIOs: " << gpios << std::endl;

    std::string uarts = toString(device->listUARTs());
    if (not uarts.empty()) ss << "  UARTs: " << uarts << std::endl;

    /*******************************************************************
     * Per-channel info
     ******************************************************************/
    for (size_t chan = 0; chan < numRxChans; chan++)
    {
        ss << probeChannel(device, SOAPY_SDR_RX, chan);
    }
    for (size_t chan = 0; chan < numTxChans; chan++)
    {
        ss << probeChannel(device, SOAPY_SDR_TX, chan);
    }

    return ss.str();
}